

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicswidget.cpp
# Opt level: O3

void QGraphicsWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined1 *puVar1;
  LayoutDirection direction;
  ColorGroup CVar2;
  uint uVar3;
  QPalette *palette;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 *paVar4;
  code *pcVar5;
  long lVar6;
  QGraphicsWidgetPrivate *pQVar7;
  QPalettePrivate *pQVar8;
  undefined8 *puVar9;
  QArrayData *pQVar10;
  int iVar11;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 aVar12;
  int *piVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long in_FS_OFFSET;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  QPointF QVar20;
  QSizeF QVar21;
  QFont fnt;
  undefined1 local_48 [16];
  undefined4 local_38;
  undefined4 uStack_34;
  ColorGroup CStack_30;
  undefined4 uStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      iVar11 = close((QGraphicsWidget *)_o,_c);
      if ((undefined1 *)*_a != (undefined1 *)0x0) {
        *(char *)*_a = (char)iVar11;
      }
    }
    else {
      if (_id == 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          iVar11 = 1;
LAB_0063dab8:
          QMetaObject::activate(_o,&staticMetaObject,iVar11,(void **)0x0);
          return;
        }
        goto LAB_0063dedc;
      }
      if (_id == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          iVar11 = 0;
          goto LAB_0063dab8;
        }
        goto LAB_0063dedc;
      }
    }
    break;
  case ReadProperty:
    if (0xd < (uint)_id) break;
    paVar4 = (anon_union_4_2_313b0b05_for_QSizePolicy_1 *)*_a;
    switch(_id) {
    case 0:
      QPalette::QPalette((QPalette *)local_48,(QPalette *)(*(long *)(_o + 0x18) + 0x188));
      uVar3 = paVar4[2].data;
      paVar4[2].data = local_48._8_4_;
      local_48._8_4_ = uVar3;
      pQVar8 = *(QPalettePrivate **)paVar4;
      *(undefined8 *)paVar4 = local_48._0_8_;
      local_48._0_8_ = pQVar8;
      QPalette::~QPalette((QPalette *)local_48);
      break;
    case 1:
      lVar6 = *(long *)(_o + 0x18);
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFont::QFont((QFont *)local_48,(QFont *)(lVar6 + 0x1a0));
      CVar2 = *(ColorGroup *)(lVar6 + 0x1b0);
      pQVar8 = *(QPalettePrivate **)paVar4;
      *(undefined8 *)paVar4 = local_48._0_8_;
      uVar3 = paVar4[2].data;
      paVar4[2].data = CVar2 | local_48._8_4_;
      local_48._8_4_ = uVar3;
      local_48._0_8_ = pQVar8;
      QFont::~QFont((QFont *)local_48);
      break;
    case 2:
      aVar12.data = *(uint *)(*(long *)(_o + 0x18) + 0x1b4) >> 1 & 1;
      goto LAB_0063de75;
    case 3:
      QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(_o + 0x20));
      *(ulong *)paVar4 = CONCAT44(uStack_34,local_38);
      *(ulong *)(paVar4 + 2) = CONCAT44(uStack_2c,CStack_30);
      break;
    case 4:
      QVar21 = QGraphicsLayoutItem::minimumSize((QGraphicsLayoutItem *)(_o + 0x20));
      uVar18 = QVar21.ht._0_4_;
      uVar19 = QVar21.ht._4_4_;
      uVar16 = QVar21.wd._0_4_;
      uVar17 = QVar21.wd._4_4_;
      goto LAB_0063de39;
    case 5:
      QVar21 = QGraphicsLayoutItem::preferredSize((QGraphicsLayoutItem *)(_o + 0x20));
      uVar18 = QVar21.ht._0_4_;
      uVar19 = QVar21.ht._4_4_;
      uVar16 = QVar21.wd._0_4_;
      uVar17 = QVar21.wd._4_4_;
      goto LAB_0063de39;
    case 6:
      QVar21 = QGraphicsLayoutItem::maximumSize((QGraphicsLayoutItem *)(_o + 0x20));
      uVar18 = QVar21.ht._0_4_;
      uVar19 = QVar21.ht._4_4_;
      uVar16 = QVar21.wd._0_4_;
      uVar17 = QVar21.wd._4_4_;
LAB_0063de39:
      *(ulong *)paVar4 = CONCAT44(uVar17,uVar16);
      *(ulong *)(paVar4 + 2) = CONCAT44(uVar19,uVar18);
      break;
    case 7:
      aVar12.bits = (Bits)QGraphicsLayoutItem::sizePolicy((QGraphicsLayoutItem *)(_o + 0x20));
      goto LAB_0063de75;
    case 8:
      aVar12 = *(anon_union_4_2_313b0b05_for_QSizePolicy_1 *)(*(long *)(_o + 0x18) + 0x1b8);
      goto LAB_0063de75;
    case 9:
      aVar12 = *(anon_union_4_2_313b0b05_for_QSizePolicy_1 *)(*(long *)(_o + 0x18) + 0x1d0);
LAB_0063de75:
      *paVar4 = aVar12;
      break;
    case 10:
      puVar9 = *(undefined8 **)(*(long *)(_o + 0x18) + 0x1d8);
      if (puVar9 == (undefined8 *)0x0) {
        piVar13 = (int *)0x0;
        uVar14 = 0;
        uVar15 = 0;
      }
      else {
        piVar13 = (int *)*puVar9;
        uVar14 = puVar9[1];
        uVar15 = puVar9[2];
        if (piVar13 == (int *)0x0) {
          piVar13 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar13 = *piVar13 + 1;
          UNLOCK();
        }
      }
      pQVar10 = *(QArrayData **)paVar4;
      *(int **)paVar4 = piVar13;
      *(undefined8 *)(paVar4 + 2) = uVar14;
      *(undefined8 *)(paVar4 + 4) = uVar15;
      if (pQVar10 != (QArrayData *)0x0) {
        LOCK();
        (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            QArrayData::deallocate(pQVar10,2,0x10);
            return;
          }
          goto LAB_0063dedc;
        }
      }
      break;
    case 0xb:
      QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(_o + 0x20));
      *(ulong *)(paVar4 + 4) = CONCAT44(uStack_34,local_38);
      *(ulong *)(paVar4 + 6) = CONCAT44(uStack_2c,CStack_30);
      *(undefined8 *)paVar4 = local_48._0_8_;
      *(undefined8 *)(paVar4 + 2) = local_48._8_8_;
      break;
    case 0xc:
      *(byte *)paVar4 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 0x18) + 0x1b4) >> 0xd) & 1;
      break;
    case 0xd:
      *(undefined8 *)paVar4 = *(undefined8 *)(*(long *)(_o + 0x18) + 0x180);
    }
    break;
  case WriteProperty:
    if ((uint)_id < 0xe) {
      palette = (QPalette *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          setPalette((QGraphicsWidget *)_o,palette);
          return;
        }
        break;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          setFont((QGraphicsWidget *)_o,(QFont *)palette);
          return;
        }
        break;
      case 2:
        direction = *(LayoutDirection *)&palette->d;
        pQVar7 = *(QGraphicsWidgetPrivate **)(_o + 0x18);
        puVar1 = &pQVar7->field_0x1b4;
        *(ushort *)puVar1 = *(ushort *)puVar1 | 1;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QGraphicsWidgetPrivate::setLayoutDirection_helper(pQVar7,direction);
          return;
        }
        break;
      case 3:
        QVar20 = QGraphicsItem::pos((QGraphicsItem *)(_o + 0x10));
        local_48._0_8_ = QVar20.xp;
        local_48._8_8_ = QVar20.yp;
        local_38 = *(undefined4 *)&palette->d;
        uStack_34 = *(undefined4 *)((long)&palette->d + 4);
        CStack_30 = palette->currentGroup;
        uStack_2c = *(undefined4 *)&palette->field_0xc;
        (**(code **)(*(long *)_o + 0x60))(_o);
        goto LAB_0063de78;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QGraphicsLayoutItem::setMinimumSize((QGraphicsLayoutItem *)(_o + 0x20),(QSizeF *)palette);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QGraphicsLayoutItem::setPreferredSize
                    ((QGraphicsLayoutItem *)(_o + 0x20),(QSizeF *)palette);
          return;
        }
        break;
      case 6:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QGraphicsLayoutItem::setMaximumSize((QGraphicsLayoutItem *)(_o + 0x20),(QSizeF *)palette);
          return;
        }
        break;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QGraphicsLayoutItem::setSizePolicy
                    ((QGraphicsLayoutItem *)(_o + 0x20),(QSizePolicy *)palette);
          return;
        }
        break;
      case 8:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          setFocusPolicy((QGraphicsWidget *)_o,*(FocusPolicy *)&palette->d);
          return;
        }
        break;
      case 9:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          setWindowFlags((QGraphicsWidget *)_o,
                         (QFlagsStorageHelper<Qt::WindowType,_4>)
                         *(QFlagsStorageHelper<Qt::WindowType,_4> *)&palette->d);
          return;
        }
        break;
      case 10:
        pQVar7 = *(QGraphicsWidgetPrivate **)(_o + 0x18);
        QGraphicsWidgetPrivate::ensureWindowData(pQVar7);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QString::operator=(&((pQVar7->windowData)._M_t.
                               super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                               .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>.
                              _M_head_impl)->windowTitle,(QString *)palette);
          return;
        }
        break;
      case 0xb:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          (**(code **)(*(long *)_o + 0x60))(_o,palette);
          return;
        }
        break;
      case 0xc:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          setAutoFillBackground((QGraphicsWidget *)_o,*(bool *)&palette->d);
          return;
        }
        break;
      case 0xd:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          setLayout((QGraphicsWidget *)_o,(QGraphicsLayout *)palette->d);
          return;
        }
      }
      goto LAB_0063dedc;
    }
    break;
  default:
    if (_id == 2 && _c == ResetProperty) {
      pQVar7 = *(QGraphicsWidgetPrivate **)(_o + 0x18);
      puVar1 = &pQVar7->field_0x1b4;
      *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfffe;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QGraphicsWidgetPrivate::resolveLayoutDirection(pQVar7);
        return;
      }
      goto LAB_0063dedc;
    }
    break;
  case IndexOfMethod:
    pcVar5 = *_a[1];
    lVar6 = *(long *)((long)_a[1] + 8);
    if (pcVar5 == geometryChanged && lVar6 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar5 == layoutChanged && lVar6 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
LAB_0063de78:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0063dedc:
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->geometryChanged(); break;
        case 1: _t->layoutChanged(); break;
        case 2: { bool _r = _t->close();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsWidget::*)()>(_a, &QGraphicsWidget::geometryChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsWidget::*)()>(_a, &QGraphicsWidget::layoutChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QPalette*>(_v) = _t->palette(); break;
        case 1: *reinterpret_cast<QFont*>(_v) = _t->font(); break;
        case 2: *reinterpret_cast<Qt::LayoutDirection*>(_v) = _t->layoutDirection(); break;
        case 3: *reinterpret_cast<QSizeF*>(_v) = _t->size(); break;
        case 4: *reinterpret_cast<QSizeF*>(_v) = _t->minimumSize(); break;
        case 5: *reinterpret_cast<QSizeF*>(_v) = _t->preferredSize(); break;
        case 6: *reinterpret_cast<QSizeF*>(_v) = _t->maximumSize(); break;
        case 7: *reinterpret_cast<QSizePolicy*>(_v) = _t->sizePolicy(); break;
        case 8: *reinterpret_cast<Qt::FocusPolicy*>(_v) = _t->focusPolicy(); break;
        case 9: *reinterpret_cast<Qt::WindowFlags*>(_v) = _t->windowFlags(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 11: *reinterpret_cast<QRectF*>(_v) = _t->geometry(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->autoFillBackground(); break;
        case 13: *reinterpret_cast<QGraphicsLayout**>(_v) = _t->layout(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPalette(*reinterpret_cast<QPalette*>(_v)); break;
        case 1: _t->setFont(*reinterpret_cast<QFont*>(_v)); break;
        case 2: _t->setLayoutDirection(*reinterpret_cast<Qt::LayoutDirection*>(_v)); break;
        case 3: _t->resize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 4: _t->setMinimumSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 5: _t->setPreferredSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 6: _t->setMaximumSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 7: _t->setSizePolicy(*reinterpret_cast<QSizePolicy*>(_v)); break;
        case 8: _t->setFocusPolicy(*reinterpret_cast<Qt::FocusPolicy*>(_v)); break;
        case 9: _t->setWindowFlags(*reinterpret_cast<Qt::WindowFlags*>(_v)); break;
        case 10: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 11: _t->setGeometry(*reinterpret_cast<QRectF*>(_v)); break;
        case 12: _t->setAutoFillBackground(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setLayout(*reinterpret_cast<QGraphicsLayout**>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 2: _t->unsetLayoutDirection(); break;
        default: break;
        }
    }
}